

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::utf8_align(Fl_Text_Buffer *this,int pos)

{
  return pos;
}

Assistant:

char Fl_Text_Buffer::byte_at(int pos) const {
  if (pos < 0 || pos >= mLength)
    return '\0';
  const char *src = address(pos);
  return *src;
}